

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)

{
  utf8proc_property_t *puVar1;
  utf8proc_int32_t local_14;
  utf8proc_int32_t cl;
  utf8proc_int32_t c_local;
  
  puVar1 = utf8proc_get_property(c);
  local_14 = c;
  if (puVar1->lowercase_seqindex != 0xffff) {
    local_14 = seqindex_decode_index((uint)puVar1->lowercase_seqindex);
  }
  return local_14;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)
{
  utf8proc_int32_t cl = utf8proc_get_property(c)->lowercase_seqindex;
  return cl != UINT16_MAX ? seqindex_decode_index(cl) : c;
}